

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderCompilationCases.cpp
# Opt level: O0

string * __thiscall
deqp::gles2::Performance::textureLookupVertexTemplate_abi_cxx11_
          (string *__return_storage_ptr__,Performance *this,ConditionalUsage conditionalUsage,
          ConditionalType conditionalType)

{
  bool bVar1;
  bool conditionVaryingNeeded;
  ConditionalType conditionalType_local;
  ConditionalUsage conditionalUsage_local;
  string *resultTemplate;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  bVar1 = (int)this != 0;
  std::__cxx11::string::operator+=
            ((string *)__return_storage_ptr__,
             "attribute highp vec4 a_position${NAME_SPEC};\nattribute mediump vec2 a_coords${NAME_SPEC};\nvarying mediump vec2 v_coords${NAME_SPEC};\n"
            );
  if (bVar1 && conditionalUsage == CONDITIONAL_USAGE_EVERY_OTHER) {
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,
               "attribute mediump float a_condition${NAME_SPEC};\nvarying mediump float v_condition${NAME_SPEC};\n"
              );
  }
  std::__cxx11::string::operator+=
            ((string *)__return_storage_ptr__,
             "\nvoid main()\n{\n\tgl_Position = a_position${NAME_SPEC} * (0.95 + 0.05*${FLOAT01});\n\tv_coords${NAME_SPEC} = a_coords${NAME_SPEC};\n"
            );
  if (bVar1 && conditionalUsage == CONDITIONAL_USAGE_EVERY_OTHER) {
    std::__cxx11::string::operator+=
              ((string *)__return_storage_ptr__,
               "\tv_condition${NAME_SPEC} = a_condition${NAME_SPEC};\n");
  }
  std::__cxx11::string::operator+=
            ((string *)__return_storage_ptr__,"${SEMANTIC_ERROR}}\n${INVALID_CHAR}");
  return __return_storage_ptr__;
}

Assistant:

static string textureLookupVertexTemplate (ConditionalUsage conditionalUsage, ConditionalType conditionalType)
{
	string	resultTemplate;
	bool	conditionVaryingNeeded = conditionalUsage != CONDITIONAL_USAGE_NONE && conditionalType == CONDITIONAL_TYPE_DYNAMIC;

	resultTemplate +=
		"attribute highp vec4 a_position${NAME_SPEC};\n"
		"attribute mediump vec2 a_coords${NAME_SPEC};\n"
		"varying mediump vec2 v_coords${NAME_SPEC};\n";

	if (conditionVaryingNeeded)
		resultTemplate +=
			"attribute mediump float a_condition${NAME_SPEC};\n"
			"varying mediump float v_condition${NAME_SPEC};\n";

	resultTemplate +=
		"\n"
		"void main()\n"
		"{\n"
		"	gl_Position = a_position${NAME_SPEC} * (0.95 + 0.05*${FLOAT01});\n"
		"	v_coords${NAME_SPEC} = a_coords${NAME_SPEC};\n";

	if (conditionVaryingNeeded)
		resultTemplate +=
			"	v_condition${NAME_SPEC} = a_condition${NAME_SPEC};\n";

	resultTemplate +=
		"${SEMANTIC_ERROR}"
		"}\n"
		"${INVALID_CHAR}";

	return resultTemplate;
}